

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long> * __thiscall
TPZFMatrix<long>::operator-(TPZFMatrix<long> *this,TPZFMatrix<long> *A)

{
  long *plVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long> *in_RDI;
  long *prlast;
  long *pr;
  int64_t size;
  long *pa;
  TPZFMatrix<long> *res;
  char *in_stack_00000138;
  char *in_stack_00000140;
  long *local_48;
  TPZFMatrix<long> *in_stack_ffffffffffffffc8;
  TPZFMatrix<long> *in_stack_ffffffffffffffd0;
  _func_int **local_28;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDX);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols(in_RDX);
    iVar3 = TPZBaseMatrix::Cols(in_RSI);
    if (iVar2 == iVar3) goto LAB_0120e12c;
  }
  Error(in_stack_00000140,in_stack_00000138);
LAB_0120e12c:
  TPZFMatrix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_28 = in_RDX[1].super_TPZSavable._vptr_TPZSavable;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  plVar1 = in_RDI->fElem;
  local_48 = plVar1;
  while (local_48 < plVar1 + iVar2 * iVar3) {
    *local_48 = *local_48 - (long)*local_28;
    local_48 = local_48 + 1;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar>
TPZFMatrix<TVar>::operator-(const TPZFMatrix<TVar> &A ) const {

    if ( (A.Rows() != this->Rows())  ||  (A.Cols() != this->Cols()) )
        Error( "Operator- <matrixs with different dimensions>" );
    
    auto res (*this);
    TVar * pa = A.fElem;
    const auto size = this->Rows()*this->Cols();
    TVar * pr = res.fElem, *prlast =pr+size;
    
    while(pr < prlast) *pr++ -= (*pa++);
    return res;
}